

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowserPrivate::QTextBrowserPrivate(QTextBrowserPrivate *this)

{
  QTextEditPrivate::QTextEditPrivate(&this->super_QTextEditPrivate);
  *(undefined ***)
   &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QTextBrowserPrivate_007d75e8;
  (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.d = (Data *)0x0;
  (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr = (HistoryEntry *)0x0;
  (this->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size = 0;
  (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.d = (Data *)0x0;
  (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.ptr = (HistoryEntry *)0x0;
  (this->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size = 0;
  QUrl::QUrl(&this->home);
  QUrl::QUrl(&this->currentURL);
  *(undefined8 *)((long)&(this->searchPaths).d.ptr + 3) = 0;
  *(undefined8 *)((long)&(this->searchPaths).d.size + 3) = 0;
  (this->searchPaths).d.d = (Data *)0x0;
  (this->searchPaths).d.ptr = (QString *)0x0;
  this->openLinks = true;
  QCursor::QCursor(&this->oldCursor);
  std::array<QMetaObject::Connection,_3UL>::array(&this->connections);
  return;
}

Assistant:

inline QTextBrowserPrivate()
        : textOrSourceChanged(false), forceLoadOnSourceChange(false), openExternalLinks(false),
          openLinks(true)
#ifdef QT_KEYPAD_NAVIGATION
        , lastKeypadScrollValue(-1)
#endif
    {}